

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O3

void kj::anon_unknown_6::registerSignalHandler(int signum)

{
  int iVar1;
  Fault f;
  sigset_t mask;
  Fault local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  sigset_t local_90;
  
  (anonymous_namespace)::tooLateToSetReserved = 1;
  do {
    iVar1 = sigemptyset(&local_90);
    if (-1 < iVar1) goto LAB_002ff23f;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_b0.exception = (Exception *)0x0;
    local_a8 = 0;
    uStack_a0 = 0;
    _::Debug::Fault::init
              (&local_b0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix.c++"
              );
    _::Debug::Fault::fatal(&local_b0);
  }
LAB_002ff23f:
  do {
    iVar1 = sigaddset(&local_90,signum);
    if (-1 < iVar1) goto LAB_002ff25f;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_b0.exception = (Exception *)0x0;
    local_a8 = 0;
    uStack_a0 = 0;
    _::Debug::Fault::init
              (&local_b0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix.c++"
              );
    _::Debug::Fault::fatal(&local_b0);
  }
LAB_002ff25f:
  do {
    iVar1 = sigprocmask(0,&local_90,(sigset_t *)0x0);
    if (-1 < iVar1) {
      return;
    }
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 == 0) {
    return;
  }
  local_b0.exception = (Exception *)0x0;
  local_a8 = 0;
  uStack_a0 = 0;
  _::Debug::Fault::init
            (&local_b0,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix.c++"
            );
  _::Debug::Fault::fatal(&local_b0);
}

Assistant:

void registerSignalHandler(int signum) {
  tooLateToSetReserved = true;

  sigset_t mask;
  KJ_SYSCALL(sigemptyset(&mask));
  KJ_SYSCALL(sigaddset(&mask, signum));
  KJ_SYSCALL(sigprocmask(SIG_BLOCK, &mask, nullptr));

#if !KJ_USE_EPOLL  // on Linux we'll use signalfd
  struct sigaction action;
  memset(&action, 0, sizeof(action));
  action.sa_sigaction = &signalHandler;
  KJ_SYSCALL(sigfillset(&action.sa_mask));
  action.sa_flags = SA_SIGINFO;
  KJ_SYSCALL(sigaction(signum, &action, nullptr));
#endif
}